

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
::~sherwood_v3_table
          (sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
           *this)

{
  clear(this);
  deallocate_data(this,this->entries,this->num_slots_minus_one,this->max_lookups);
  return;
}

Assistant:

~sherwood_v3_table()
    {
        clear();
        deallocate_data(entries, num_slots_minus_one, max_lookups);
    }